

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall Temperature_Reaumur_Test::TestBody(Temperature_Reaumur_Test *this)

{
  double dVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_120;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_4;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  AssertHelper local_60;
  Message local_58 [3];
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  precise_unit re;
  Temperature_Reaumur_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x3ff4000000000000;
  local_39 = units::is_temperature((precise_unit *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar2) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_38,
               (AssertionResult *)"is_temperature(re)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x176,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  dVar1 = units::convert<units::unit,units::precise_unit>
                    (313.15,(unit *)&units::K,(precise_unit *)&gtest_ar_.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_90,"convert(313.15, K, re)","32.0","test::tolerance",dVar1,32.0,1e-06
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x177,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  dVar1 = units::convert<units::precise_unit,units::precise_unit>
                    (32.0,(precise_unit *)&gtest_ar_.message_,(precise_unit *)units::precise::degC);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b0,"convert(32.0, re, precise::degC)","40.0","test::tolerance",dVar1,
             40.0,1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x178,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  dVar1 = units::convert<units::precise_unit,units::precise_unit>
                    (40.0,(precise_unit *)units::precise::degC,(precise_unit *)&gtest_ar_.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_d0,"convert(40.0, precise::degC, re)","32.0","test::tolerance",dVar1,
             32.0,1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x179,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  dVar1 = units::convert<units::precise_unit,units::precise_unit>
                    (563.67,(precise_unit *)units::precise::temperature::rankine,
                     (precise_unit *)&gtest_ar_.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_f0,"convert(563.67, precise::temperature::rankine, re)","32.0",
             "test::tolerance",dVar1,32.0,1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x17d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  dVar1 = units::convert<units::precise_unit,units::unit>
                    (32.0,(precise_unit *)&gtest_ar_.message_,(unit *)&units::degF);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_110,"convert(32.0, re, degF)","104.0","test::tolerance",dVar1,104.0,
             1e-06);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x17e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  return;
}

Assistant:

TEST(Temperature, Reaumur)
{
    using namespace units;
    auto re = precise::temperature::reaumur;

    EXPECT_TRUE(is_temperature(re));
    EXPECT_NEAR(convert(313.15, K, re), 32.0, test::tolerance);
    EXPECT_NEAR(convert(32.0, re, precise::degC), 40.0, test::tolerance);
    EXPECT_NEAR(convert(40.0, precise::degC, re), 32.0, test::tolerance);
    EXPECT_NEAR(
        convert(563.67, precise::temperature::rankine, re),
        32.0,
        test::tolerance);
    EXPECT_NEAR(convert(32.0, re, degF), 104.0, test::tolerance);
}